

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmCmpiRg<(moira::Instr)39,(moira::Mode)0,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  i32 v;
  StrWriter *pSVar2;
  ushort in_CX;
  StrWriter *in_RSI;
  Moira *in_RDI;
  Dn dst;
  Ims src;
  u32 *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Align align;
  Dn local_24;
  Ims local_20;
  ushort local_1a;
  StrWriter *local_10;
  
  local_1a = in_CX;
  local_10 = in_RSI;
  uVar1 = dasmRead<(moira::Size)1>(in_RDI,in_stack_ffffffffffffffb8);
  v = SEXT<(moira::Size)1>((ulong)uVar1);
  Ims::Ims(&local_20,v);
  Dn::Dn(&local_24,local_1a & 7);
  pSVar2 = StrWriter::operator<<(local_10);
  pSVar2 = StrWriter::operator<<(pSVar2);
  align.raw = (in_RDI->tab).raw;
  StrWriter::operator<<(pSVar2,align);
  pSVar2 = StrWriter::operator<<
                     ((StrWriter *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (Ims)align.raw);
  pSVar2 = StrWriter::operator<<(pSVar2,", ");
  StrWriter::operator<<(pSVar2,local_24);
  return;
}

Assistant:

void
Moira::dasmCmpiRg(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Ims ( SEXT<S>(dasmRead<S>(addr)) );
    auto dst = Dn  ( _____________xxx(op)       );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}